

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O0

void RigidBodyDynamics::CalcMInvTimesTau
               (Model *model,VectorNd *Q,VectorNd *Tau,VectorNd *QDDot,bool update_kinematics)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  Scalar *pSVar7;
  reference pvVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  reference ppCVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  byte in_R8B;
  ReturnType RVar12;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar13;
  uint z;
  VectorNd qdd_temp_1;
  uint dofI_2;
  uint kI_2;
  Vector3d qdd_temp;
  SpatialTransform X_lambda;
  uint lambda_6;
  uint q_index_2;
  uint i_4;
  SpatialVector pa_2;
  uint lambda_5;
  VectorNd tau_temp_1;
  uint dofI_1;
  uint kI_1;
  SpatialVector pa_1;
  uint lambda_4;
  Vector3d tau_temp;
  SpatialVector pa;
  uint lambda_3;
  uint q_index_1;
  uint i_3;
  SpatialMatrix Ia_2;
  uint lambda_2;
  uint dofI;
  uint kI;
  SpatialMatrix Ia_1;
  uint lambda_1;
  SpatialMatrix Ia;
  uint lambda;
  uint q_index;
  uint i_2;
  uint i_1;
  uint i;
  SpatialTransform *in_stack_ffffffffffffeaf8;
  SpatialTransform *in_stack_ffffffffffffeb00;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
  *in_stack_ffffffffffffeb08;
  MatrixBase<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
  *in_stack_ffffffffffffeb10;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffeb18;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
  *in_stack_ffffffffffffeb20;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffeb28;
  Index in_stack_ffffffffffffeb30;
  double *in_stack_ffffffffffffeb38;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffeb40;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffeb48;
  Vector3_t *in_stack_ffffffffffffeb50;
  Scalar SVar14;
  SpatialMatrix *in_stack_ffffffffffffebb8;
  SpatialRigidBodyInertia *in_stack_ffffffffffffebc0;
  SpatialVector *in_stack_ffffffffffffecc0;
  SpatialTransform *in_stack_ffffffffffffecc8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar15;
  undefined4 in_stack_ffffffffffffecf0;
  undefined4 in_stack_ffffffffffffecf4;
  uint uVar16;
  undefined1 in_stack_ffffffffffffed00 [16];
  uint local_10e4;
  uint local_d54;
  VectorNd *in_stack_fffffffffffff918;
  uint in_stack_fffffffffffff924;
  Model *in_stack_fffffffffffff928;
  uint local_30;
  uint local_2c;
  uint local_28;
  
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
  if ((in_R8B & 1) != 0) {
    for (local_28 = 1;
        sVar5 = std::
                vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                        *)&in_RDI[0x22].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish), local_28 < sVar5;
        local_28 = local_28 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &in_RDI[0xb].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      jcalc_X_lambda_S(in_stack_fffffffffffff928,in_stack_fffffffffffff924,in_stack_fffffffffffff918
                      );
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1b),(ulong)local_28);
      std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                 &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      Math::SpatialRigidBodyInertia::setSpatialMatrix
                (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
    }
  }
  for (local_2c = 1;
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_2c < sVar5;
      local_2c = local_2c + 1) {
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb00);
  }
  if ((in_R8B & 1) != 0) {
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    local_30 = (uint)sVar5;
    while (local_30 = local_30 - 1, local_30 != 0) {
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&in_RDI[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
      if ((pvVar6->mDoFCount == 1) &&
         (pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_30), pvVar6->mJointType != JointTypeCustom)) {
        std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                  ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                   &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)in_stack_ffffffffffffeaf8);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
                 dot<Eigen::Matrix<double,6,1,0,6,1>>
                           ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            in_stack_ffffffffffffeb00,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            in_stack_ffffffffffffeaf8);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        *pSVar7 = RVar12;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RDI,(ulong)local_30);
        uVar3 = *pvVar8;
        if (uVar3 != 0) {
          std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                    ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                     &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                     in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator/
                    (in_stack_ffffffffffffeb48,(double *)in_stack_ffffffffffffeb40);
          Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
          ::transpose(in_stack_ffffffffffffeb08);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                    (in_stack_ffffffffffffeb18,in_stack_ffffffffffffeb10);
          Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator-
                    ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeb28,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>
                      *)in_stack_ffffffffffffeb20);
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                    ((SpatialMatrix_t *)in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                      *)in_stack_ffffffffffffeaf8);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(in_RDI + 0x1f),(ulong)local_30);
          Math::SpatialTransform::toMatrixTranspose(in_stack_ffffffffffffed00._0_8_);
          Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeaf8)
          ;
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(in_RDI + 0x1f),(ulong)local_30);
          Math::SpatialTransform::toMatrix
                    ((SpatialTransform *)
                     CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>>
          ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                       *)in_stack_ffffffffffffeb10,
                      (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeb08
                     );
          std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                    ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                     &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::noalias
                    ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeaf8)
          ;
          Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::MatrixBase> *)
                     in_stack_ffffffffffffeb20,
                     (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                      *)in_stack_ffffffffffffeb18);
        }
      }
      else {
        pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30)
        ;
        if ((pvVar6->mDoFCount == 3) &&
           (pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_30), pvVar6->mJointType != JointTypeCustom)) {
          std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                    ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                     &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&in_RDI[0xe].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeaf8)
          ;
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&in_RDI[0xf].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          Eigen::Matrix<double,6,3,0,6,3>::operator=
                    ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_ffffffffffffeb00,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                      *)in_stack_ffffffffffffeaf8);
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&in_RDI[0xe].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeaf8);
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&in_RDI[0xf].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                     in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeaf8)
          ;
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
          ::inverse((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                     *)0x8154a5);
          Eigen::
          DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>_>
          ::eval((DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>_>
                  *)in_stack_ffffffffffffeb08);
          std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                    ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                     &in_RDI[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
          Matrix3_t::operator=
                    (&in_stack_ffffffffffffeb00->E,
                     (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffeaf8)
          ;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_RDI,(ulong)local_30);
          uVar3 = *pvVar8;
          if (uVar3 != 0) {
            std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                      ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                       &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
            std::
            vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                          *)&in_RDI[0xf].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
            std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                      ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                       &in_RDI[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
            Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_ffffffffffffeaf8);
            std::
            vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                          *)&in_RDI[0xf].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
            Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeaf8
                      );
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                         *)in_stack_ffffffffffffeb10,
                        (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                        in_stack_ffffffffffffeb08);
            Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator-
                      ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                       in_stack_ffffffffffffeb28,
                       (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>
                        *)in_stack_ffffffffffffeb20);
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                      ((SpatialMatrix_t *)in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                        *)in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(in_RDI + 0x1f),(ulong)local_30);
            Math::SpatialTransform::toMatrixTranspose(in_stack_ffffffffffffed00._0_8_);
            Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                       in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                       in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(in_RDI + 0x1f),(ulong)local_30);
            Math::SpatialTransform::toMatrix
                      ((SpatialTransform *)
                       CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>>
            ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                         *)in_stack_ffffffffffffeb10,
                        (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                        in_stack_ffffffffffffeb08);
            std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                      ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                       &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::noalias
                      ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                       in_stack_ffffffffffffeaf8);
            Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                      ((NoAlias<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::MatrixBase> *)
                       in_stack_ffffffffffffeb20,
                       (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                        *)in_stack_ffffffffffffeb18);
          }
        }
        else {
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_30);
          if (pvVar6->mJointType == JointTypeCustom) {
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_30);
            uVar3 = pvVar6->custom_joint_index;
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                      ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                       &in_RDI[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                       in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                      ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffeb00,
                       (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                        *)in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                       in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffeaf8);
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
            ::inverse((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                       *)0x81589e);
            Eigen::
            DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>
            ::eval((DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
                    *)in_stack_ffffffffffffeb08);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                      ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffeb00,
                       (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffeaf8);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)0x81590e);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (in_RDI,(ulong)local_30);
            uVar4 = *pvVar8;
            if (uVar4 != 0) {
              std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                        ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                         &in_RDI[0x15].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
              std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)&in_RDI[0x13].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
              std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)&in_RDI[0x13].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffeb00,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffeaf8);
              std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)&in_RDI[0x13].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffeaf8);
              Eigen::
              MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
              ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                           *)in_stack_ffffffffffffeb10,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)in_stack_ffffffffffffeb08);
              Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator-
                        ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                         in_stack_ffffffffffffeb28,
                         (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                          *)in_stack_ffffffffffffeb20);
              SpatialMatrix_t::
              SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                        ((SpatialMatrix_t *)in_stack_ffffffffffffeb00,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                          *)in_stack_ffffffffffffeaf8);
              std::
              vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                            *)(in_RDI + 0x1f),(ulong)local_30);
              Math::SpatialTransform::toMatrixTranspose(in_stack_ffffffffffffed00._0_8_);
              Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                         in_stack_ffffffffffffeb00,
                         (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                         in_stack_ffffffffffffeaf8);
              std::
              vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                            *)(in_RDI + 0x1f),(ulong)local_30);
              Math::SpatialTransform::toMatrix
                        ((SpatialTransform *)
                         CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              Eigen::
              MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>>
              ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                           *)in_stack_ffffffffffffeb10,
                          (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                          in_stack_ffffffffffffeb08);
              std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                        ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                         &in_RDI[0x15].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ulong)uVar4);
              Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::noalias
                        ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                         in_stack_ffffffffffffeaf8);
              Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                        ((NoAlias<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::MatrixBase> *)
                         in_stack_ffffffffffffeb20,
                         (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                          *)in_stack_ffffffffffffeb18);
            }
          }
        }
      }
    }
  }
  sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)&in_RDI[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  local_d54 = (uint)sVar5;
  while( true ) {
    PVar15.m_rhs = (RhsNested)in_stack_ffffffffffffecc8;
    PVar15.m_lhs = (LhsNested)in_stack_ffffffffffffecc0;
    local_d54 = local_d54 - 1;
    PVar13.m_rhs = (RhsNested)in_stack_ffffffffffffeb08;
    PVar13.m_lhs = (LhsNested)in_stack_ffffffffffffeb10;
    if (local_d54 == 0) break;
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
    if ((pvVar6->mDoFCount == 1) &&
       (pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54
                             ), pvVar6->mJointType != JointTypeCustom)) {
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
      dVar1 = *pdVar9;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
      RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
               dot<Eigen::Matrix<double,6,1,0,6,1>>
                         ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                          in_stack_ffffffffffffeb00,
                          (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                          in_stack_ffffffffffffeaf8);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
      *pSVar7 = dVar1 - RVar12;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_d54);
      uVar3 = *pvVar8;
      if (uVar3 != 0) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  (in_stack_ffffffffffffeb48,(double *)in_stack_ffffffffffffeb40);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
        ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_ffffffffffffeb48,(double *)in_stack_ffffffffffffeb40);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb28,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                    *)in_stack_ffffffffffffeb20);
        SpatialVector_t::
        SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)in_stack_ffffffffffffeaf8);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1f),(ulong)local_d54);
        Math::SpatialTransform::applyTranspose(in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
        Eigen::MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::noalias
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8);
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::MatrixBase> *)
                   in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
      }
    }
    else {
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&in_RDI[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
      if ((pvVar6->mDoFCount == 3) &&
         (pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_d54), pvVar6->mJointType != JointTypeCustom)) {
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        Vector3_t::Vector3_t
                  (in_stack_ffffffffffffeb50,(double *)in_stack_ffffffffffffeb48,
                   (double *)in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeaf8);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                  ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                   in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffeb28,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)in_stack_ffffffffffffeb20);
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                  ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
                   &in_RDI[0x11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
        Vector3_t::operator=
                  ((Vector3_t *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)in_stack_ffffffffffffeaf8);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RDI,(ulong)local_d54);
        uVar3 = *pvVar8;
        if (uVar3 != 0) {
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&in_RDI[0xf].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
          std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                    ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                     &in_RDI[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
          Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffeaf8)
          ;
          std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                    ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
                     &in_RDI[0x11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
          ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                       *)in_stack_ffffffffffffeb10,
                      (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffeb08
                     );
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb28,
                     (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)in_stack_ffffffffffffeb20);
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)in_stack_ffffffffffffeaf8);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(in_RDI + 0x1f),(ulong)local_d54);
          Math::SpatialTransform::applyTranspose
                    (in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::noalias
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8)
          ;
          Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::MatrixBase> *)
                     in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
        }
      }
      else {
        pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54
                             );
        if (pvVar6->mJointType == JointTypeCustom) {
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_d54);
          uVar3 = pvVar6->custom_joint_index;
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<unsigned_int,int>
                    (in_stack_ffffffffffffeb40,(Index)in_stack_ffffffffffffeb38,
                     in_stack_ffffffffffffeb30,(uint)((ulong)in_stack_ffffffffffffeb28 >> 0x20),
                     (int)in_stack_ffffffffffffeb28);
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,_1,false>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffeb10,
                     (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)
                     in_stack_ffffffffffffeb08);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_ffffffffffffeaf8);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
          Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8)
          ;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    (in_stack_ffffffffffffeb28,in_stack_ffffffffffffeb20);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                    ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffeb00,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                      *)in_stack_ffffffffffffeaf8);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_RDI,(ulong)local_d54);
          uVar4 = *pvVar8;
          if (uVar4 != 0) {
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d54);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
            ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                         *)in_stack_ffffffffffffeb10,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_ffffffffffffeb08);
            Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       in_stack_ffffffffffffeb28,
                       (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                        *)in_stack_ffffffffffffeb20);
            SpatialVector_t::
            SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                      ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                        *)in_stack_ffffffffffffeaf8);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(in_RDI + 0x1f),(ulong)local_d54);
            Math::SpatialTransform::applyTranspose
                      (in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar4);
            Eigen::MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::noalias
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       in_stack_ffffffffffffeaf8);
            Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                      ((NoAlias<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::MatrixBase> *)
                       in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
          }
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)0x816551);
        }
      }
    }
  }
  for (local_10e4 = 1;
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_10e4 < sVar5;
      local_10e4 = local_10e4 + 1) {
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_10e4);
    uVar3 = *pvVar8;
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RDI + 0x1f),(ulong)local_10e4);
    Math::SpatialTransform::SpatialTransform(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
    Math::SpatialTransform::apply((SpatialTransform *)PVar15.m_rhs,(SpatialVector *)PVar15.m_lhs);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &in_RDI[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb28,
               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb20);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_ffffffffffffeb00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)in_stack_ffffffffffffeaf8);
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
    if ((pvVar6->mDoFCount == 1) &&
       (pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (ulong)local_10e4), pvVar6->mJointType != JointTypeCustom)) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
      dVar1 = *pSVar7;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
      dVar2 = *pSVar7;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
      RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
               dot<Eigen::Matrix<double,6,1,0,6,1>>
                         ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                          in_stack_ffffffffffffeb00,
                          (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                          in_stack_ffffffffffffeaf8);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
      *pSVar7 = (1.0 / dVar1) * (dVar2 - RVar12);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                (in_stack_ffffffffffffeb48,(double *)in_stack_ffffffffffffeb40);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb28,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                  *)in_stack_ffffffffffffeb20);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                  *)in_stack_ffffffffffffeaf8);
    }
    else {
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&in_RDI[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4)
      ;
      if ((pvVar6->mDoFCount == 3) &&
         (pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_10e4), pvVar6->mJointType != JointTypeCustom)) {
        in_stack_ffffffffffffeb48 =
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                       ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                        &in_RDI[0x10].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        in_stack_ffffffffffffeb40 =
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                       ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
                        &in_RDI[0x11].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&in_RDI[0xf].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeaf8);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                  ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                   in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffeb28,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)in_stack_ffffffffffffeb20);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffeb18,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)PVar13.m_lhs);
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Vector3_t *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)in_stack_ffffffffffffeaf8);
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                             in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        SVar14 = *pSVar10;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        *pSVar7 = SVar14;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                             in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        SVar14 = *pSVar10;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        *pSVar7 = SVar14;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                             in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        SVar14 = *pSVar10;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
        *pSVar7 = SVar14;
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffeaf8);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb28,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)in_stack_ffffffffffffeb20);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)in_stack_ffffffffffffeaf8);
      }
      else {
        pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (ulong)local_10e4);
        if (pvVar6->mJointType == JointTypeCustom) {
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_10e4);
          uVar3 = pvVar6->custom_joint_index;
          ppCVar11 = std::
                     vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                     ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                   *)&in_RDI[0x13].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)uVar3);
          uVar4 = *(uint *)(*ppCVar11 + 8);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_ffffffffffffeaf8);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
          Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeaf8)
          ;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    (in_stack_ffffffffffffeb28,in_stack_ffffffffffffeb20);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_ffffffffffffeb18,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                      *)PVar13.m_lhs);
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffeb00,
                     (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                      *)in_stack_ffffffffffffeaf8);
          for (uVar16 = 0; uVar16 < uVar4; uVar16 = uVar16 + 1) {
            in_stack_ffffffffffffeb28 =
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
            in_stack_ffffffffffffeb18 =
                 *(MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> **)in_stack_ffffffffffffeb28;
            in_stack_ffffffffffffeb20 =
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               in_stack_ffffffffffffeb00,(Index)in_stack_ffffffffffffeaf8);
            *(MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> **)in_stack_ffffffffffffeb20 =
                 in_stack_ffffffffffffeb18;
          }
          in_stack_ffffffffffffeb00 =
               (SpatialTransform *)
               std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                         ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                          &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          PVar13 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              in_stack_ffffffffffffeb00,
                              (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              in_stack_ffffffffffffeaf8);
          PVar15 = PVar13;
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffeb28,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                      *)in_stack_ffffffffffffeb20);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10e4);
          SpatialVector_t::operator=
                    ((SpatialVector_t *)in_stack_ffffffffffffeb00,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)in_stack_ffffffffffffeaf8);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)0x816e81);
        }
      }
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcMInvTimesTau ( Model &model,
    const VectorNd &Q,
    const VectorNd &Tau,
    VectorNd &QDDot,
    bool update_kinematics) {

  LOG << "Q          = " << Q.transpose() << std::endl;
  LOG << "---" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].setZero();

  if (update_kinematics) {
    for (unsigned int i = 1; i < model.mBodies.size(); i++) {
      jcalc_X_lambda_S (model, model.mJointUpdateOrder[i], Q);

      model.v_J[i].setZero();
      model.v[i].setZero();
      model.c[i].setZero();
      model.pA[i].setZero();
      model.I[i].setSpatialMatrix (model.IA[i]);
    }
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    model.pA[i].setZero();
  }

  // ClearLogOutput();

  if (update_kinematics) {
    // Compute Articulate Body Inertias
    for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
      unsigned int q_index = model.mJoints[i].q_index;

      if (model.mJoints[i].mDoFCount == 1
          && model.mJoints[i].mJointType != JointTypeCustom) {
        model.U[i] = model.IA[i] * model.S[i];
        model.d[i] = model.S[i].dot(model.U[i]);
        //      LOG << "u[" << i << "] = " << model.u[i] << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] - 
            model.U[i] * (model.U[i] / model.d[i]).transpose();

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mDoFCount == 3
          && model.mJoints[i].mJointType != JointTypeCustom) {

        model.multdof3_U[i] = model.IA[i] * model.multdof3_S[i];

#ifdef RBDL_USE_CASADI_MATH
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose() * model.multdof3_U[i]).inverse();
#else
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose()*model.multdof3_U[i]).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u[i].transpose() << std::endl;

        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i]
            - ( model.multdof3_U[i]
                * model.multdof3_Dinv[i]
                * model.multdof3_U[i].transpose());

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mJointType == JointTypeCustom) {
        unsigned int kI     = model.mJoints[i].custom_joint_index;
        unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
        model.mCustomJoints[kI]->U = model.IA[i] * model.mCustomJoints[kI]->S;

#ifdef RBDL_USE_CASADI_MATH
        model.mCustomJoints[kI]->Dinv=(model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse();
#else
        model.mCustomJoints[kI]->Dinv = (model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u.transpose() << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] 
            - ( model.mCustomJoints[kI]->U
                * model.mCustomJoints[kI]->Dinv
                * model.mCustomJoints[kI]->U.transpose());
#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      }
    }
  }

  // compute articulated bias forces
  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {

      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);
      // LOG << "u[" << i << "] = " << model.u[i] << std::endl;
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialVector pa = model.pA[i] + model.U[i] * model.u[i] / model.d[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {

      Vector3d tau_temp ( Tau[q_index],
          Tau[q_index + 1],
          Tau[q_index + 2]);
      model.multdof3_u[i] = tau_temp 
        - model.multdof3_S[i].transpose()*model.pA[i];
      //      LOG << "multdof3_u[" << i << "] = "
      // << model.multdof3_u[i].transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + model.multdof3_U[i]
          * model.multdof3_Dinv[i]
          * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd tau_temp(Tau.block(q_index,0,dofI,1));

      model.mCustomJoints[kI]->u = 
        tau_temp - ( model.mCustomJoints[kI]->S.transpose()* model.pA[i]);
      //      LOG << "mCustomJoints[kI]->u"
      // << model.mCustomJoints[kI]->u.transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + (   model.mCustomJoints[kI]->U
              * model.mCustomJoints[kI]->Dinv
              * model.mCustomJoints[kI]->u);

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    }
  }

  //  ClearLogOutput();

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i])*(model.u[i]-model.U[i].dot(model.a[i]));
      model.a[i]     = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = 
        model.multdof3_Dinv[i] * (model.multdof3_u[i]
            - model.multdof3_U[i].transpose()*model.a[i]);

      QDDot[q_index]      = qdd_temp[0];
      QDDot[q_index + 1]  = qdd_temp[1];
      QDDot[q_index + 2]  = qdd_temp[2];
      model.a[i]          = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;

      VectorNd qdd_temp = model.mCustomJoints[kI]->Dinv
        * (  model.mCustomJoints[kI]->u 
            - model.mCustomJoints[kI]->U.transpose() * model.a[i]);

      for(unsigned z = 0; z < dofI; ++z){
        QDDot[q_index+z]      = qdd_temp[z];
      }

      model.a[i] =    model.a[i]
        + model.mCustomJoints[kI]->S * qdd_temp;
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}